

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O3

void __thiscall fmcalc::init_fmxref(fmcalc *this)

{
  char *pcVar1;
  mapped_type mVar2;
  long *plVar3;
  undefined8 *puVar4;
  FILE *pFVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  undefined8 extraout_RAX;
  long *plVar8;
  fmXref f;
  string file;
  undefined8 local_90;
  int local_88;
  undefined4 uStack_84;
  long local_80;
  long lStack_78;
  undefined1 local_70 [32];
  key_type local_50 [2];
  undefined1 local_40 [16];
  
  pcVar1 = local_70 + 0x10;
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"input/fm_xref_a0.bin","");
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
    plVar3 = (long *)std::__cxx11::string::replace
                               ((ulong)local_50,0,(char *)0x0,
                                (ulong)(this->inputpath_)._M_dataplus._M_p);
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar3;
    }
    local_88 = (int)plVar3[1];
    uStack_84 = (undefined4)((ulong)plVar3[1] >> 0x20);
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_50[0] != (key_type)local_40) {
      operator_delete((void *)local_50[0]);
    }
  }
  if (this->allocrule_ == 0) {
    pFVar5 = fopen((char *)local_70._0_8_,"rb");
    if (pFVar5 != (FILE *)0x0) {
      fclose(pFVar5);
      goto LAB_00105441;
    }
  }
  std::__cxx11::string::_M_replace((ulong)local_70,0,(char *)local_70._8_8_,0x1101da);
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)local_50,0,(char *)0x0,(ulong)(this->inputpath_)._M_dataplus._M_p);
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_80 = *plVar3;
      lStack_78 = puVar4[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar3;
      local_90 = (long *)*puVar4;
    }
    local_88 = (int)puVar4[1];
    uStack_84 = (undefined4)((ulong)puVar4[1] >> 0x20);
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_50[0] != (key_type)local_40) {
      operator_delete((void *)local_50[0]);
    }
  }
LAB_00105441:
  pFVar5 = fopen((char *)local_70._0_8_,"rb");
  if (pFVar5 != (FILE *)0x0) {
    sVar6 = fread(&local_90,0xc,1,pFVar5);
    if (sVar6 != 0) {
      plVar3 = local_90;
      do {
        local_90._4_4_ = (int)((ulong)plVar3 >> 0x20);
        local_90._0_4_ = (mapped_type)plVar3;
        mVar2 = (mapped_type)local_90;
        local_50[0].layer_id = local_88;
        local_50[0].agg_id = local_90._4_4_;
        local_90 = plVar3;
        pmVar7 = std::
                 map<fmxref_key,_int,_std::less<fmxref_key>,_std::allocator<std::pair<const_fmxref_key,_int>_>_>
                 ::operator[](&fm_xrefmap,local_50);
        *pmVar7 = mVar2;
        sVar6 = fread(&local_90,0xc,1,pFVar5);
        plVar3 = local_90;
      } while (sVar6 != 0);
    }
    fclose(pFVar5);
    if ((char *)local_70._0_8_ != pcVar1) {
      operator_delete((void *)local_70._0_8_);
    }
    return;
  }
  init_fmxref((fmcalc *)local_70);
  if (local_50[0] != (key_type)local_40) {
    operator_delete((void *)local_50[0]);
  }
  if ((char *)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void fmcalc::init_fmxref()
{
	FILE *fin = NULL;
	std::string file = FMXREF_FILE_A0;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	if (allocrule_ == 0  && fileexists(file) ) {		
		fin = fopen(file.c_str(), "rb");
	}
	else {
		file = FMXREF_FILE;
		if (inputpath_.length() > 0) {
			file = inputpath_ + file.substr(5);
		}
		fin = fopen(file.c_str(), "rb");
	}
	
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	fmXref f;
	size_t i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {
		fmxref_key k;
		k.agg_id = f.agg_id;
		k.layer_id = f.layer_id;
/*
		if (k.agg_id == f.output_id && k.layer_id == 1) {
			// skip it
		}else {
			fm_xrefmap[k] = f.output_id;
		}
*/
		fm_xrefmap[k] = f.output_id;
		i = fread(&f, sizeof(f),  1, fin);
	}
	fclose(fin);	
}